

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantUtil.cpp
# Opt level: O0

void vkt::pipeline::requireFeatures
               (InstanceInterface *vki,VkPhysicalDevice physDevice,FeatureFlags flags)

{
  NotSupportedError *pNVar1;
  allocator<char> local_1c9;
  string local_1c8;
  undefined1 local_1a2;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_17a;
  allocator<char> local_179;
  string local_178;
  undefined1 local_152;
  allocator<char> local_151;
  string local_150;
  undefined1 local_12d;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  VkPhysicalDeviceFeatures features;
  FeatureFlags flags_local;
  VkPhysicalDevice physDevice_local;
  InstanceInterface *vki_local;
  
  features.variableMultisampleRate = flags;
  unique0x100002f8 = physDevice;
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)local_f8,vki,physDevice);
  if (((features.variableMultisampleRate & 1) != 0) && (features.independentBlend == 0)) {
    local_12d = 1;
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Tessellation shader not supported",&local_119);
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_118);
    local_12d = 0;
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((features.variableMultisampleRate & 2) != 0) && (features.imageCubeArray == 0)) {
    local_152 = 1;
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Geometry shader not supported",&local_151);
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_150);
    local_152 = 0;
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((features.variableMultisampleRate & 4) != 0) && (features.shaderClipDistance == 0)) {
    local_17a = 1;
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Double-precision floats not supported",&local_179);
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_178);
    local_17a = 0;
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((features.variableMultisampleRate & 8) != 0) && (features.occlusionQueryPrecise == 0)) {
    local_1a2 = 1;
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"SSBO and image writes not supported in vertex pipeline",
               &local_1a1);
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_1a0);
    local_1a2 = 0;
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((features.variableMultisampleRate & 0x10) != 0) && (features.pipelineStatisticsQuery == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"SSBO and image writes not supported in fragment shader",
               &local_1c9);
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_1c8);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  return;
}

Assistant:

void requireFeatures (const InstanceInterface& vki, const VkPhysicalDevice physDevice, const FeatureFlags flags)
{
	const VkPhysicalDeviceFeatures features = getPhysicalDeviceFeatures(vki, physDevice);

	if (((flags & FEATURE_TESSELLATION_SHADER) != 0) && !features.tessellationShader)
		throw tcu::NotSupportedError("Tessellation shader not supported");

	if (((flags & FEATURE_GEOMETRY_SHADER) != 0) && !features.geometryShader)
		throw tcu::NotSupportedError("Geometry shader not supported");

	if (((flags & FEATURE_SHADER_FLOAT_64) != 0) && !features.shaderFloat64)
		throw tcu::NotSupportedError("Double-precision floats not supported");

	if (((flags & FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS) != 0) && !features.vertexPipelineStoresAndAtomics)
		throw tcu::NotSupportedError("SSBO and image writes not supported in vertex pipeline");

	if (((flags & FEATURE_FRAGMENT_STORES_AND_ATOMICS) != 0) && !features.fragmentStoresAndAtomics)
		throw tcu::NotSupportedError("SSBO and image writes not supported in fragment shader");
}